

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_C2_Req.cpp
# Opt level: O1

bool __thiscall SRUP_MSG_SYNDICATED_C2_REQ::Serialize(SRUP_MSG_SYNDICATED_C2_REQ *this,bool preSign)

{
  uint16_t l;
  uint uVar1;
  uint8_t uVar2;
  bool bVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  if ((this->super_SRUP_MSG).m_token == (uint8_t *)0x0) {
    return false;
  }
  puVar5 = (uint8_t *)operator_new__(1);
  puVar6 = (uint8_t *)operator_new__(1);
  if (((this->super_SRUP_MSG).m_sequence_ID == (uint64_t *)0x0) ||
     ((this->super_SRUP_MSG).m_sender_ID == (uint64_t *)0x0)) {
LAB_00194101:
    operator_delete__(puVar5);
    operator_delete__(puVar6);
    bVar3 = false;
  }
  else {
    if (preSign) {
      iVar4 = (uint)this->m_data_len + (uint)(this->super_SRUP_MSG).m_token_len;
      iVar8 = 6;
    }
    else {
      iVar4 = (uint)this->m_data_len +
              (uint)(this->super_SRUP_MSG).m_token_len + (uint)(this->super_SRUP_MSG).m_sig_len;
      iVar8 = 8;
    }
    (this->super_SRUP_MSG).m_serial_length = iVar4 + iVar8 + 0x13;
    puVar7 = (this->super_SRUP_MSG).m_serialized;
    if (puVar7 != (uint8_t *)0x0) {
      operator_delete__(puVar7);
    }
    uVar10 = (ulong)(this->super_SRUP_MSG).m_serial_length;
    puVar7 = (uint8_t *)operator_new__(uVar10);
    (this->super_SRUP_MSG).m_serialized = puVar7;
    lVar9 = 0;
    memset(puVar7,0,uVar10);
    *puVar7 = *(this->super_SRUP_MSG).m_version;
    puVar7[1] = *(this->super_SRUP_MSG).m_msgtype;
    do {
      uVar2 = SRUP_MSG::getByteVal(*(this->super_SRUP_MSG).m_sequence_ID,(uint8_t)lVar9);
      (this->super_SRUP_MSG).m_serialized[lVar9 + 2] = uVar2;
      lVar9 = lVar9 + 1;
    } while ((int)lVar9 != 8);
    lVar9 = 0;
    do {
      uVar2 = SRUP_MSG::getByteVal(*(this->super_SRUP_MSG).m_sender_ID,(uint8_t)lVar9);
      (this->super_SRUP_MSG).m_serialized[lVar9 + 10] = uVar2;
      lVar9 = lVar9 + 1;
    } while ((int)lVar9 != 8);
    SRUP_MSG::encodeLength(puVar6,puVar5,(this->super_SRUP_MSG).m_token_len);
    (this->super_SRUP_MSG).m_serialized[0x12] = *puVar5;
    (this->super_SRUP_MSG).m_serialized[0x13] = *puVar6;
    memcpy((this->super_SRUP_MSG).m_serialized + 0x14,(this->super_SRUP_MSG).m_token,
           (ulong)(this->super_SRUP_MSG).m_token_len);
    uVar11 = (ulong)(this->super_SRUP_MSG).m_token_len;
    uVar10 = uVar11 + 0x14;
    if (!preSign) {
      if (((this->super_SRUP_MSG).m_signature == (uint8_t *)0x0) ||
         (l = (this->super_SRUP_MSG).m_sig_len, l == 0)) goto LAB_00194101;
      SRUP_MSG::encodeLength(puVar6,puVar5,l);
      (this->super_SRUP_MSG).m_serialized[uVar10] = *puVar5;
      (this->super_SRUP_MSG).m_serialized[uVar11 + 0x15] = *puVar6;
      memcpy((this->super_SRUP_MSG).m_serialized + uVar11 + 0x16,(this->super_SRUP_MSG).m_signature,
             (ulong)(this->super_SRUP_MSG).m_sig_len);
      uVar10 = (ulong)((uint)(this->super_SRUP_MSG).m_sig_len + (int)(uVar11 + 0x16));
    }
    SRUP_MSG::encodeLength(puVar6,puVar5,this->m_data_len);
    (this->super_SRUP_MSG).m_serialized[uVar10] = *puVar5;
    (this->super_SRUP_MSG).m_serialized[uVar10 + 1] = *puVar6;
    memcpy((this->super_SRUP_MSG).m_serialized + uVar10 + 2,this->m_data,(ulong)this->m_data_len);
    (this->super_SRUP_MSG).m_serialized[this->m_data_len + uVar10 + 2] = *this->m_req_id;
    operator_delete__(puVar5);
    operator_delete__(puVar6);
    if (preSign) {
      puVar5 = (this->super_SRUP_MSG).m_unsigned_message;
      if (puVar5 != (uint8_t *)0x0) {
        operator_delete__(puVar5);
      }
      uVar1 = (this->super_SRUP_MSG).m_serial_length;
      puVar6 = (uint8_t *)operator_new__((ulong)uVar1);
      (this->super_SRUP_MSG).m_unsigned_message = puVar6;
      puVar5 = (this->super_SRUP_MSG).m_serialized;
      memcpy(puVar6,puVar5,(ulong)uVar1);
      (this->super_SRUP_MSG).m_unsigned_length = uVar1;
      (this->super_SRUP_MSG).m_serial_length = 0;
      if (puVar5 != (uint8_t *)0x0) {
        operator_delete__(puVar5);
      }
      (this->super_SRUP_MSG).m_serialized = (uint8_t *)0x0;
    }
    (this->super_SRUP_MSG).m_is_serialized = true;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool SRUP_MSG_SYNDICATED_C2_REQ::Serialize (bool preSign)
{
    {
        // As we're using dynamic memory - and only storing / sending the length of the data we have
        // we need to know how long all of the fields are so that we can unmarshall the data at
        // the other end...

        const uint16_t header_size = 18; // Two-bytes for the main header - plus 8 for the sequence ID ...
        // 8 for the sender ID
        const uint8_t field_length_size = 2;

        // We need the number of variable length fields - including the m_sig_len...
        // ... this can't be const as we need to change it depending on whether or not we're in pre-sign.
        // (If we are we need to reduce it by one for the unused m_sig_len)
        // We have the signature, the token, the data_ID & the data...
        uint8_t var_length_field_count = 4;

        const uint8_t len_req_id = 1; // 1 byte for the 8-bit request ID.

        uint32_t serial_len;
        uint32_t p=0;

        uint8_t * msb;
        uint8_t * lsb;

        if (m_token == nullptr)
            return false;

        msb=new uint8_t[1];
        lsb=new uint8_t[1];

        // Now check that we have a sequence ID...
        if (m_sequence_ID == nullptr)
        {
            delete[] msb;
            delete[] lsb;
            return false;
        }

        // ...and check that we have a sender ID
        if (m_sender_ID == nullptr)
        {
            delete[] msb;
            delete[] lsb;
            return false;
        }


        // If we're calling this as a prelude to signing / verifying then we need to exclude the signature data from the
        // serial data we generate...

        if (preSign)
        {
            serial_len = m_token_len + m_data_len + len_req_id;
            var_length_field_count--;
        }
        else
            serial_len = m_sig_len + m_token_len + m_data_len + len_req_id;

        m_serial_length = serial_len + header_size + (field_length_size * var_length_field_count);

        delete[] m_serialized;

        m_serialized = new uint8_t[m_serial_length];
        std::memset(m_serialized, 0, m_serial_length);

        // The first two fields are fixed length (1 byte each).
        std::memcpy(m_serialized, m_version, 1);
        p+=1;
        std::memcpy(m_serialized + p, m_msgtype, 1);
        p+=1;

        // Now we need to add the Sequence ID (uint64_t)
        // See SRUP_Init.cpp for details...
        for (int x=0;x<8;x++)
        {
            uint8_t byte;
            byte = getByteVal(*m_sequence_ID, x);
            std::memcpy(m_serialized + p, &byte, 1);
            p+=1;
        }

        // And we need to do the same thing for the Sender ID (uint64_t)
        for (int x=0;x<8;x++)
        {
            uint8_t byte;
            byte = getByteVal(*m_sender_ID, x);
            std::memcpy(m_serialized + p, &byte, 1);
            p+=1;
        }

        // All of the other fields need their length to be specified...

        encodeLength(lsb, msb, m_token_len);
        std::memcpy(m_serialized + p, msb, 1);
        p+=1;
        std::memcpy(m_serialized + p, lsb, 1);
        p+=1;
        std::memcpy(m_serialized + p, m_token, m_token_len);
        p+=m_token_len;

        // If we're executing Serialize as a part of generating the signature - we can't marshall the signature
        // as we haven't calculated it yet. So only do the signature if we're not in preSign

        if (!preSign)
        {
            if (m_signature == nullptr)
            {
                delete[] msb;
                delete[] lsb;
                return false;
            }
            else
            {
                if (m_sig_len == 0)
                {
                    delete[] msb;
                    delete[] lsb;
                    return false;
                }
                else
                {
                    encodeLength(lsb, msb, m_sig_len);
                    std::memcpy(m_serialized + p, msb, 1);
                    p += 1;
                    std::memcpy(m_serialized + p, lsb, 1);
                    p += 1;
                    std::memcpy(m_serialized + p, m_signature, m_sig_len);
                    p += m_sig_len;
                }
            }
        }

        // Now for the actual data...
        encodeLength(lsb, msb, m_data_len);
        std::memcpy(m_serialized + p, msb, 1);
        p+=1;
        std::memcpy(m_serialized + p, lsb, 1);
        p+=1;
        std::memcpy(m_serialized + p, m_data, m_data_len);
        p+=m_data_len;

        // Lastly we need to add the request ID...
        std::memcpy(m_serialized + p, m_req_id, 1);

        delete[] msb;
        delete[] lsb;

        // If we're in preSign we don't have a real value for m_serialized - so copy the data to m_unsigned_message
        // and discard (and reset) m_serialized & m_serial_length...
        if (preSign)
        {
            delete[] m_unsigned_message;
            m_unsigned_message = new unsigned char[m_serial_length];

            std::memcpy(m_unsigned_message, m_serialized, m_serial_length);
            m_unsigned_length = m_serial_length;

            m_serial_length = 0;
            delete[] m_serialized;
            m_serialized= nullptr;
        }

        m_is_serialized = true;
        return true;

    }
}